

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall vm::VM::Tastore<int>(VM *this)

{
  int iVar1;
  slot_t sVar2;
  int iVar3;
  slot_t *psVar4;
  
  ensureStackUsed(this,1);
  iVar1 = this->_sp;
  this->_sp = iVar1 + -1;
  sVar2 = (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar1 + -1];
  ensureStackUsed(this,1);
  iVar1 = this->_sp;
  this->_sp = iVar1 + -1;
  iVar1 = (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar1 + -1];
  ensureStackUsed(this,1);
  iVar3 = this->_sp;
  this->_sp = iVar3 + -1;
  psVar4 = checkAddr(this,iVar1 + (this->_stack)._M_t.
                                  super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                  super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar3 + -1]
                     ,1);
  *psVar4 = sVar2;
  return;
}

Assistant:

void VM::Tastore() {
    auto value = POP<T>();
    addr_t addr = slots_count<T> * POP<addr_t>();
    addr += POP<addr_t>();
    WRITE(addr, value);
}